

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eve.cpp
# Opt level: O2

void eve::randomiseevents
               (OASIS_INT pno_,OASIS_INT total_,vector<int,_std::allocator<int>_> *events,
               bool textmode)

{
  uint uVar1;
  result_type rVar2;
  uint *puVar3;
  iterator it;
  uint *__ptr;
  int iVar4;
  int iVar5;
  uniform_int_distribution<int> d;
  default_random_engine e;
  
  e._M_x = 0x4d2;
  __ptr = (uint *)(events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
  puVar3 = (uint *)(events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  iVar4 = -pno_;
  iVar5 = (int)((ulong)((long)puVar3 - (long)__ptr) >> 2);
  for (; iVar4 = iVar4 + 1, iVar5 = iVar5 + -1, __ptr != puVar3; __ptr = __ptr + 1) {
    d._M_param._M_a = 0;
    d._M_param._M_b = iVar5;
    rVar2 = std::uniform_int_distribution<int>::operator()(&d,&e);
    uVar1 = *__ptr;
    *__ptr = __ptr[rVar2];
    __ptr[rVar2] = uVar1;
    if (iVar4 % total_ == 0) {
      if (textmode) {
        fprintf(_stdout,"%d\n",(ulong)*__ptr);
      }
      else {
        fwrite(__ptr,4,1,_stdout);
      }
    }
    puVar3 = (uint *)(events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
  }
  return;
}

Assistant:

void randomiseevents(OASIS_INT pno_, OASIS_INT total_,
			 std::vector<int> &events, bool textmode) {

	unsigned seed = 1234;
	std::default_random_engine e(seed);

	// As we only consider swapping each element once as we go through the
	// vector sequentially, we can output events IDs as we proceed. We are
	// only interested in a particular process ID, so only output events IDs
	// assigned to that process
	auto eventsSize = events.size();
	int counter = 1;
	for (std::vector<int>::iterator it = events.begin(); it != events.end();
	     it++) {

	    // Implement Fisher-Yates shuffle
	    std::uniform_int_distribution<> d(0, --eventsSize);
	    std::iter_swap(it, it + d(e));

	    if ((counter - pno_) % total_ == 0) {

		if (textmode) fprintf(stdout, "%d\n", *it);
		else fwrite(&(*it), sizeof(*it), 1, stdout);

	    }
	    counter++;

	}

    }